

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O3

union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>>>>
          (union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *first,owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *last)

{
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  undefined8 local_18;
  
  local_28 = *(undefined8 *)this;
  p_Stack_20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)this = 0;
  local_18 = *(undefined8 *)(this + 0x10);
  local_48 = *(undefined4 *)
              &(first->m_container).
               super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  uStack_44 = *(undefined4 *)
               ((long)&(first->m_container).
                       super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 4);
  uStack_40 = *(undefined4 *)
               &(first->m_container).
                super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  uStack_3c = *(undefined4 *)
               ((long)&(first->m_container).
                       super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 4);
  (first->m_container).
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (first->m_container).
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_38 = (first->m_iterator)._M_current;
  union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>
  ::union_iterator(__return_storage_ptr__,&local_28,&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3c,uStack_40) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3c,uStack_40));
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_union_iterator (RandomAccessIterator first, RandomAccessIterator last)
    {
        return union_iterator<RandomAccessIterator>(std::move(first), std::move(last));
    }